

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,string *groupName)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  char *local_158;
  char *option_1;
  char *local_130;
  char *option;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string prefix;
  cmCPackComponentGroup group;
  string *groupName_local;
  cmCPackIFWPackage *this_local;
  
  group.Subgroups.
  super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)groupName;
  cmCPackComponentGroup::cmCPackComponentGroup((cmCPackComponentGroup *)((long)&prefix.field_2 + 8))
  ;
  cmsys::SystemTools::UpperCase
            (&local_118,
             (string *)
             group.Subgroups.
             super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+(&local_f8,"CPACK_COMPONENT_GROUP_",&local_118);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 &local_f8,"_");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "DISPLAY_NAME");
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
  std::__cxx11::string::~string((string *)&option_1);
  local_130 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::operator=
              ((string *)(group.Name.field_2._M_local_buf + 8),
               (string *)(prefix.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=((string *)(group.Name.field_2._M_local_buf + 8),pcVar3);
  }
  std::operator+(&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "DESCRIPTION");
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  local_158 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)(group.DisplayName.field_2._M_local_buf + 8),pcVar3);
  }
  std::operator+(&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "BOLD_TITLE");
  bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_198);
  group.Description.field_2._M_local_buf[8] =
       group.Description.field_2._M_local_buf[8] & 0xfeU | bVar1;
  std::__cxx11::string::~string((string *)&local_198);
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "EXPANDED");
  bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_1b8);
  group.Description.field_2._M_local_buf[8] =
       group.Description.field_2._M_local_buf[8] & 0xfdU | bVar1 * '\x02';
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::operator=
            ((string *)(prefix.field_2._M_local_buf + 8),
             (string *)
             group.Subgroups.
             super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((this->super_cmCPackIFWCommon).Generator == (cmCPackIFWGenerator *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&this->Name,(string *)(prefix.field_2._M_local_buf + 8));
  }
  else {
    cmCPackIFWGenerator::GetGroupPackageName_abi_cxx11_
              (&local_1d8,(this->super_cmCPackIFWCommon).Generator,
               (cmCPackComponentGroup *)((long)&prefix.field_2 + 8));
    std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  iVar2 = ConfigureFromGroup(this,(cmCPackComponentGroup *)((long)&prefix.field_2 + 8));
  std::__cxx11::string::~string((string *)local_d8);
  cmCPackComponentGroup::~cmCPackComponentGroup
            ((cmCPackComponentGroup *)((long)&prefix.field_2 + 8));
  return iVar2;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(const std::string& groupName)
{
  // Group configuration

  cmCPackComponentGroup group;
  std::string prefix =
    "CPACK_COMPONENT_GROUP_" + cmsys::SystemTools::UpperCase(groupName) + "_";

  if (const char* option = this->GetOption(prefix + "DISPLAY_NAME")) {
    group.DisplayName = option;
  } else {
    group.DisplayName = group.Name;
  }

  if (const char* option = this->GetOption(prefix + "DESCRIPTION")) {
    group.Description = option;
  }
  group.IsBold = this->IsOn(prefix + "BOLD_TITLE");
  group.IsExpandedByDefault = this->IsOn(prefix + "EXPANDED");

  // Package configuration

  group.Name = groupName;

  if (Generator) {
    this->Name = this->Generator->GetGroupPackageName(&group);
  } else {
    this->Name = group.Name;
  }

  return this->ConfigureFromGroup(&group);
}